

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

mt32emu_return_code
mt32emu_merge_and_add_rom_data
          (mt32emu_context context,mt32emu_bit8u *part1_data,size_t part1_data_size,
          mt32emu_sha1_digest *part1_sha1_digest,mt32emu_bit8u *part2_data,size_t part2_data_size,
          mt32emu_sha1_digest *part2_sha1_digest)

{
  mt32emu_return_code mVar1;
  ArrayFile *local_c0;
  ArrayFile *local_a8;
  mt32emu_return_code rc;
  ArrayFile *file2;
  ArrayFile *file1;
  size_t part2_data_size_local;
  mt32emu_bit8u *part2_data_local;
  mt32emu_sha1_digest *part1_sha1_digest_local;
  size_t part1_data_size_local;
  mt32emu_bit8u *part1_data_local;
  mt32emu_context context_local;
  
  if (part1_sha1_digest == (mt32emu_sha1_digest *)0x0) {
    local_a8 = (ArrayFile *)operator_new(0x50);
    MT32Emu::ArrayFile::ArrayFile(local_a8,part1_data,part1_data_size);
  }
  else {
    local_a8 = (ArrayFile *)operator_new(0x50);
    MT32Emu::ArrayFile::ArrayFile(local_a8,part1_data,part1_data_size,part1_sha1_digest);
  }
  if (part2_sha1_digest == (mt32emu_sha1_digest *)0x0) {
    local_c0 = (ArrayFile *)operator_new(0x50);
    MT32Emu::ArrayFile::ArrayFile(local_c0,part2_data,part2_data_size);
  }
  else {
    local_c0 = (ArrayFile *)operator_new(0x50);
    MT32Emu::ArrayFile::ArrayFile(local_c0,part2_data,part2_data_size,part2_sha1_digest);
  }
  mVar1 = MT32Emu::addROMFiles
                    (context,(File *)local_a8,(File *)local_c0,(MachineConfiguration *)0x0);
  if (local_a8 != (ArrayFile *)0x0) {
    (*(local_a8->super_AbstractFile).super_File._vptr_File[1])();
  }
  if (local_c0 != (ArrayFile *)0x0) {
    (*(local_c0->super_AbstractFile).super_File._vptr_File[1])();
  }
  return mVar1;
}

Assistant:

mt32emu_return_code MT32EMU_C_CALL mt32emu_merge_and_add_rom_data(mt32emu_context context, const mt32emu_bit8u *part1_data, size_t part1_data_size, const mt32emu_sha1_digest *part1_sha1_digest, const mt32emu_bit8u *part2_data, size_t part2_data_size, const mt32emu_sha1_digest *part2_sha1_digest) {
	ArrayFile *file1 = part1_sha1_digest == NULL ? new ArrayFile(part1_data, part1_data_size) : new ArrayFile(part1_data, part1_data_size, *part1_sha1_digest);
	ArrayFile *file2 = part2_sha1_digest == NULL ? new ArrayFile(part2_data, part2_data_size) : new ArrayFile(part2_data, part2_data_size, *part2_sha1_digest);
	mt32emu_return_code rc = addROMFiles(context, file1, file2);
	delete file1;
	delete file2;
	return rc;
}